

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t zesGetDriverProcAddrTable(ze_api_version_t version,zes_driver_dditable_t *pDdiTable)

{
  zes_pfnDriverEventListenEx_t p_Var1;
  zes_pfnDriverGetExtensionProperties_t p_Var2;
  ze_api_version_t *pzVar3;
  ze_result_t zVar4;
  
  pzVar3 = validation_layer::context;
  if (pDdiTable == (zes_driver_dditable_t *)0x0) {
    zVar4 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnEventListenEx;
      *(zes_pfnDriverEventListen_t *)(validation_layer::context + 0x274) = pDdiTable->pfnEventListen
      ;
      *(zes_pfnDriverEventListenEx_t *)(pzVar3 + 0x276) = p_Var1;
      pDdiTable->pfnEventListen = validation_layer::zesDriverEventListen;
      pDdiTable->pfnEventListenEx = validation_layer::zesDriverEventListenEx;
      p_Var2 = pDdiTable->pfnGetExtensionProperties;
      *(zes_pfnDriverGet_t *)(pzVar3 + 0x278) = pDdiTable->pfnGet;
      *(zes_pfnDriverGetExtensionProperties_t *)(pzVar3 + 0x27a) = p_Var2;
      pDdiTable->pfnGet = validation_layer::zesDriverGet;
      pDdiTable->pfnGetExtensionProperties = validation_layer::zesDriverGetExtensionProperties;
      *(zes_pfnDriverGetExtensionFunctionAddress_t *)(pzVar3 + 0x27c) =
           pDdiTable->pfnGetExtensionFunctionAddress;
      pDdiTable->pfnGetExtensionFunctionAddress =
           validation_layer::zesDriverGetExtensionFunctionAddress;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar4;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetDriverProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_driver_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.Driver;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnEventListen                              = pDdiTable->pfnEventListen;
    pDdiTable->pfnEventListen                            = validation_layer::zesDriverEventListen;

    dditable.pfnEventListenEx                            = pDdiTable->pfnEventListenEx;
    pDdiTable->pfnEventListenEx                          = validation_layer::zesDriverEventListenEx;

    dditable.pfnGet                                      = pDdiTable->pfnGet;
    pDdiTable->pfnGet                                    = validation_layer::zesDriverGet;

    dditable.pfnGetExtensionProperties                   = pDdiTable->pfnGetExtensionProperties;
    pDdiTable->pfnGetExtensionProperties                 = validation_layer::zesDriverGetExtensionProperties;

    dditable.pfnGetExtensionFunctionAddress              = pDdiTable->pfnGetExtensionFunctionAddress;
    pDdiTable->pfnGetExtensionFunctionAddress            = validation_layer::zesDriverGetExtensionFunctionAddress;

    return result;
}